

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

DecimalQuantity * __thiscall
icu_63::number::impl::DecimalQuantity::setToLong(DecimalQuantity *this,int64_t n)

{
  setBcdToZero(this);
  this->flags = '\0';
  if (0x8000000000000000 < (ulong)n) {
    this->flags = '\x01';
    n = -n;
  }
  if (n != 0) {
    _setToLong(this,n);
    compact(this);
  }
  return this;
}

Assistant:

DecimalQuantity &DecimalQuantity::setToLong(int64_t n) {
    setBcdToZero();
    flags = 0;
    if (n < 0 && n > INT64_MIN) {
        flags |= NEGATIVE_FLAG;
        n = -n;
    }
    if (n != 0) {
        _setToLong(n);
        compact();
    }
    return *this;
}